

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O2

void mqc_erterm_enc(opj_mqc_t *mqc)

{
  int iVar1;
  
  iVar1 = 0xc;
  while( true ) {
    iVar1 = iVar1 - mqc->ct;
    if (iVar1 < 1) break;
    mqc->c = mqc->c << ((byte)mqc->ct & 0x1f);
    mqc->ct = 0;
    mqc_byteout(mqc);
  }
  if (*mqc->bp != 0xff) {
    mqc_byteout(mqc);
    return;
  }
  return;
}

Assistant:

void mqc_erterm_enc(opj_mqc_t *mqc) {
	int k = 11 - mqc->ct + 1;
	
	while (k > 0) {
		mqc->c <<= mqc->ct;
		mqc->ct = 0;
		mqc_byteout(mqc);
		k -= mqc->ct;
	}
	
	if (*mqc->bp != 0xff) {
		mqc_byteout(mqc);
	}
}